

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O2

bool __thiscall capnp::AnyStruct::Reader::operator==(Reader *this,Reader right)

{
  Equality EVar1;
  bool bVar2;
  Fault f;
  Fault local_10;
  
  EVar1 = equals(this,right);
  if (EVar1 == NOT_EQUAL) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (EVar1 != EQUAL) {
      if (EVar1 == UNKNOWN_CONTAINS_CAPS) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[107]>
                  (&local_10,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any.c++"
                   ,0xf7,FAILED,(char *)0x0,
                   "\"operator== cannot determine equality of capabilities; use equals() instead if you need to handle this case\""
                   ,(char (*) [107])
                    "operator== cannot determine equality of capabilities; use equals() instead if you need to handle this case"
                  );
        kj::_::Debug::Fault::fatal(&local_10);
      }
      kj::_::unreachable();
    }
  }
  return bVar2;
}

Assistant:

bool AnyStruct::Reader::operator==(AnyStruct::Reader right) const {
  switch(equals(right)) {
    case Equality::EQUAL:
      return true;
    case Equality::NOT_EQUAL:
      return false;
    case Equality::UNKNOWN_CONTAINS_CAPS:
      KJ_FAIL_REQUIRE(
        "operator== cannot determine equality of capabilities; use equals() instead if you need to handle this case");
  }
  KJ_UNREACHABLE;
}